

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QGate1<std::complex<float>_>::apply
          (QGate1<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  complex<float> *pcVar1;
  uint __line;
  int iVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  char *__assertion;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int64_t k;
  ulong uVar11;
  bool bVar12;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float extraout_XMM0_Db_06;
  SquareMatrix<std::complex<float>_> mat1;
  complex<float> x2;
  complex<float> x1;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> local_68;
  long local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  SquareMatrix<std::complex<float>_> local_40;
  
  if (nbQubits < 1) {
    __assertion = "nbQubits >= 1";
    __line = 0x1f;
  }
  else {
    bVar4 = (byte)nbQubits;
    if (matrix->size_ == (long)(1 << (bVar4 & 0x1f))) {
      iVar2 = (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[3])();
      if (iVar2 + offset < nbQubits) {
        (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])(&mat1,this);
        dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(op,&mat1);
        bVar5 = (byte)(iVar2 + offset);
        if (side == Left) {
          if (nbQubits == 1) {
            dense::SquareMatrix<std::complex<float>_>::operator*=(matrix,&mat1);
          }
          else {
            bVar4 = ~bVar5 + bVar4 & 0x1f;
            lVar6 = (long)(1 << bVar4);
            local_60 = lVar6 * 2;
            uVar8 = (ulong)(uint)(0 << bVar4);
            local_58 = 0;
            if (0 < lVar6) {
              local_58 = lVar6;
            }
            local_50 = (ulong)(uint)(1 << (bVar5 & 0x1f));
            if (1 << (bVar5 & 0x1f) < 1) {
              local_50 = uVar8;
            }
            for (; (long)uVar8 < matrix->size_; uVar8 = uVar8 + 1) {
              uVar7 = 0;
              for (uVar11 = 0; lVar9 = local_58, local_48 = uVar7, uVar11 != local_50;
                  uVar11 = uVar11 + 1) {
                while (bVar12 = lVar9 != 0, lVar9 = lVar9 + -1, bVar12) {
                  pcVar1 = (matrix->data_)._M_t.
                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                           .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                  x1._M_value = pcVar1[matrix->size_ * uVar7 + uVar8]._M_value;
                  x2._M_value = pcVar1[matrix->size_ * (lVar6 + uVar7) + uVar8]._M_value;
                  std::operator*((complex<float> *)
                                 mat1.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                 .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl,
                                 &x1);
                  std::operator*((complex<float> *)
                                 ((long)mat1.data_._M_t.
                                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                        .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                        _M_head_impl + 8),&x2);
                  (matrix->data_)._M_t.
                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                  [matrix->size_ * uVar7 + uVar8]._M_value =
                       CONCAT44(extraout_XMM0_Db + extraout_XMM0_Db_00,
                                extraout_XMM0_Da + extraout_XMM0_Da_00);
                  std::operator*((complex<float> *)
                                 (mat1.size_ * 8 +
                                 (long)mat1.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl),&x1);
                  std::operator*((complex<float> *)
                                 ((long)mat1.data_._M_t.
                                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                        .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                        _M_head_impl + mat1.size_ * 8 + 8),&x2);
                  (matrix->data_)._M_t.
                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                  [(lVar6 + uVar7) * matrix->size_ + uVar8]._M_value =
                       CONCAT44(extraout_XMM0_Db_01 + extraout_XMM0_Db_02,
                                extraout_XMM0_Da_01 + extraout_XMM0_Da_02);
                  uVar7 = uVar7 + 1;
                }
                uVar7 = local_48 + local_60;
              }
            }
          }
        }
        else if (nbQubits == 1) {
          dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_40,&mat1);
          dense::operator*((dense *)&x1,&local_40,matrix);
          dense::SquareMatrix<std::complex<float>_>::operator=
                    (matrix,(SquareMatrix<std::complex<float>_> *)&x1);
          std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
          ~unique_ptr(&local_68);
          std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
          ~unique_ptr(&local_40.data_);
        }
        else {
          uVar7 = (ulong)(1 << (~bVar5 + bVar4 & 0x1f));
          uVar8 = 0;
          local_50 = 0;
          if (0 < (long)uVar7) {
            local_50 = uVar7;
          }
          local_48 = (ulong)(uint)(1 << (bVar5 & 0x1f));
          if (1 << (bVar5 & 0x1f) < 1) {
            local_48 = uVar8;
          }
          local_58 = uVar7 << 4;
          lVar6 = 0;
          while (lVar6 < matrix->size_) {
            lVar9 = 0;
            local_60 = lVar6;
            for (uVar11 = 0; lVar6 = lVar9, uVar10 = local_50, uVar11 != local_48;
                uVar11 = uVar11 + 1) {
              while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
                lVar3 = matrix->size_ * uVar8;
                pcVar1 = (matrix->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                x1._M_value = *(_ComplexT *)((long)&pcVar1->_M_value + lVar6 + lVar3);
                x2._M_value = *(_ComplexT *)((long)&pcVar1[uVar7]._M_value + lVar6 + lVar3);
                std::operator*((complex<float> *)
                               mat1.data_._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl,&x1
                              );
                std::operator*((complex<float> *)
                               (mat1.size_ * 8 +
                               (long)mat1.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl),&x2);
                *(ulong *)((long)&((matrix->data_)._M_t.
                                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                                  )->_M_value + lVar6 + matrix->size_ * uVar8) =
                     CONCAT44(extraout_XMM0_Db_03 + extraout_XMM0_Db_04,
                              extraout_XMM0_Da_03 + extraout_XMM0_Da_04);
                std::operator*((complex<float> *)
                               ((long)mat1.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                      .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl + 8),&x1);
                std::operator*((complex<float> *)
                               ((long)mat1.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                      .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl + mat1.size_ * 8 + 8),&x2);
                *(ulong *)((long)&(matrix->data_)._M_t.
                                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                                  [uVar7]._M_value + lVar6 + matrix->size_ * uVar8) =
                     CONCAT44(extraout_XMM0_Db_05 + extraout_XMM0_Db_06,
                              extraout_XMM0_Da_05 + extraout_XMM0_Da_06);
                lVar6 = lVar6 + 8;
              }
              lVar9 = lVar9 + local_58;
            }
            uVar8 = uVar8 + 8;
            lVar6 = local_60 + 1;
          }
        }
        std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
        ~unique_ptr(&mat1.data_);
        return;
      }
      __assertion = "qubit < nbQubits";
      __line = 0x22;
    }
    else {
      __assertion = "matrix.size() == 1 << nbQubits";
      __line = 0x20;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/src/qgates/QGate1.cpp"
                ,__line,
                "virtual void qclab::qgates::QGate1<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
               );
}

Assistant:

void QGate1< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 1 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit = this->qubit() + offset ;
    assert( qubit < nbQubits ) ;
    // operation
    qclab::dense::SquareMatrix< T >  mat1 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 1 ) {
        matrix *= mat1 ;
      } else {
        // matrix *= kron( Ileft , mat1 , Iright )
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 1 ) {
        matrix = mat1 * matrix ;
      } else {
        // matrix = kron( Ileft , mat1 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }